

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O1

bool __thiscall ON_Geometry::SwapCoordinates(ON_Geometry *this,int i,int j)

{
  undefined1 uVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  ON_Xform *pOVar5;
  ON_Xform *pOVar6;
  ulong uVar7;
  byte bVar8;
  ON_Xform swapij;
  ON_Xform local_b0;
  
  bVar8 = 0;
  iVar2 = (*(this->super_ON_Object)._vptr_ON_Object[0x18])();
  uVar1 = 0;
  if (((((uint)j < 3) && ((uint)i < 3)) && (uVar1 = 0, iVar2 - 1U < 3)) && (uVar1 = 1, i != j)) {
    pOVar5 = &ON_Xform::ZeroTransformation;
    pOVar6 = &local_b0;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      pOVar6->m_xform[0][0] = pOVar5->m_xform[0][0];
      pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar8 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    lVar4 = 0;
    uVar7 = 0;
    do {
      if ((uint)i == uVar7) {
        pdVar3 = ON_Xform::operator[](&local_b0,(int)uVar7);
        pdVar3 = pdVar3 + (uint)j;
      }
      else {
        pdVar3 = ON_Xform::operator[](&local_b0,(int)uVar7);
        if ((uint)j == uVar7) {
          pdVar3 = pdVar3 + (uint)i;
        }
        else {
          pdVar3 = (double *)((long)pdVar3 + lVar4);
        }
      }
      *pdVar3 = 1.0;
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar7 != 4);
    iVar2 = (*(this->super_ON_Object)._vptr_ON_Object[0x1c])(this,&local_b0);
    uVar1 = (undefined1)iVar2;
  }
  return (bool)uVar1;
}

Assistant:

bool ON_Geometry::SwapCoordinates(
      int i, int j        // indices of coords to swap
      )
{
  bool rc = false;
  const int dim = Dimension();
  if ( dim > 0 && dim <= 3 && i >= 0 && i < 3 && j >= 0 && j < 3 ) {
    if ( i == j ) {
      rc = true;
    }
    else {
      int k;
      ON_Xform swapij(ON_Xform::ZeroTransformation);
      for ( k = 0; k < 4; k++ ) {
        if ( i == k )
          swapij[k][j] = 1.0;
        else if ( j == k )
          swapij[k][i] = 1.0;
        else
          swapij[k][k] = 1.0;
      }
      rc = Transform( swapij );
    }
  }
  return rc;
}